

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ismsnoop.cpp
# Opt level: O0

DataType ismsnoop::find_data(ifstream *ifs,int byte_offset,
                            shared_ptr<ismsnoop::VersionHandler> *handler)

{
  uint uVar1;
  int iVar2;
  size_type sVar3;
  element_type *peVar4;
  streamoff sVar5;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_c0;
  const_iterator local_b8;
  fpos<__mbstate_t> local_b0;
  fpos<__mbstate_t> local_a0;
  undefined4 local_8c;
  fpos<__mbstate_t> local_88;
  fpos<__mbstate_t> local_78;
  int local_68 [2];
  int next;
  value_type_conflict1 local_58;
  int local_54;
  uint32_t x;
  int i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> buffer;
  pos_type start;
  shared_ptr<ismsnoop::VersionHandler> *handler_local;
  int byte_offset_local;
  ifstream *ifs_local;
  
  std::istream::seekg((long)ifs,byte_offset);
  buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)std::istream::tellg();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&x);
  for (local_54 = 0; local_54 < 0x80; local_54 = local_54 + 1) {
    std::istream::read((char *)ifs,(long)&local_58);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&x,&local_58);
  }
  do {
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&x);
    if (sVar3 < 0x10) {
      ifs_local._4_4_ = None;
LAB_0010ee89:
      local_8c = 1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&x);
      return ifs_local._4_4_;
    }
    local_68[0] = 0;
    peVar4 = std::
             __shared_ptr_access<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)handler);
    uVar1 = (*peVar4->_vptr_VersionHandler[1])(peVar4,&x,local_68);
    if ((uVar1 & 1) != 0) {
      iVar2 = local_68[0] << 2;
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&x);
      std::fpos<__mbstate_t>::fpos(&local_88,(long)iVar2 + (0x80 - sVar3) * 4);
      sVar5 = std::fpos::operator_cast_to_long((fpos *)&local_88);
      local_78 = std::fpos<__mbstate_t>::operator+
                           ((fpos<__mbstate_t> *)
                            &buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,sVar5);
      sVar5 = std::fpos::operator_cast_to_long((fpos *)&local_78);
      std::istream::seekg((long)ifs,(_Ios_Seekdir)sVar5);
      ifs_local._4_4_ = BackgroundImage;
      goto LAB_0010ee89;
    }
    peVar4 = std::
             __shared_ptr_access<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)handler);
    uVar1 = (*peVar4->_vptr_VersionHandler[2])(peVar4,&x,local_68);
    if ((uVar1 & 1) != 0) {
      iVar2 = local_68[0] << 2;
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&x);
      std::fpos<__mbstate_t>::fpos(&local_b0,(long)iVar2 + (0x80 - sVar3) * 4);
      sVar5 = std::fpos::operator_cast_to_long((fpos *)&local_b0);
      local_a0 = std::fpos<__mbstate_t>::operator+
                           ((fpos<__mbstate_t> *)
                            &buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,sVar5);
      sVar5 = std::fpos::operator_cast_to_long((fpos *)&local_a0);
      std::istream::seekg((long)ifs,(_Ios_Seekdir)sVar5);
      ifs_local._4_4_ = InfoText;
      goto LAB_0010ee89;
    }
    local_c0._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&x);
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                *)&local_b8,&local_c0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&x,local_b8);
  } while( true );
}

Assistant:

static DataType find_data(std::ifstream & ifs, int byte_offset, std::shared_ptr<VersionHandler> handler)
{
	ifs.seekg(byte_offset, std::ios::cur);

	auto start = ifs.tellg();

	std::vector<uint32_t> buffer;

	for (int i = 0; i < 128; i++)
	{
		uint32_t x;
		ifs.read((char*)(&x), 4);
		buffer.push_back(x);
	}

	while (buffer.size() > 15)
	{
		int next = 0;

		if (handler->looks_like_a_background_image(buffer, &next))
		{
			ifs.seekg(start + (std::streampos((next * 4) + ((128 - buffer.size()) * 4))), std::ios::beg);
			return DataType::BackgroundImage;
		}

		if (handler->looks_like_the_info_text(buffer, &next))
		{
			ifs.seekg(start + (std::streampos((next * 4) + ((128 - buffer.size()) * 4))), std::ios::beg);
			return DataType::InfoText;
		}

		buffer.erase(buffer.begin());
	}

	return DataType::None;
}